

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall
embree::CommandLineParser::parseCommandLine(CommandLineParser *this,int argc,char **argv)

{
  CommandLineOption **ppCVar1;
  string *psVar2;
  _Base_ptr cin;
  FileName *in_RDI;
  Ref<embree::ParseStream> stream;
  undefined8 in_stack_fffffffffffffe60;
  undefined1 multiLine;
  string *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  Ref<embree::Stream<int>_> *in_stack_fffffffffffffe78;
  ParseStream *this_00;
  int in_stack_fffffffffffffecc;
  CommandLineStream *in_stack_fffffffffffffed0;
  undefined1 local_109 [40];
  allocator local_e1;
  string local_e0 [38];
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [48];
  _Base_ptr local_88;
  string *local_80;
  CommandLineParser *this_01;
  
  multiLine = (undefined1)((ulong)in_stack_fffffffffffffe60 >> 0x38);
  psVar2 = (string *)::operator_new(0x48);
  cin = (_Base_ptr)::operator_new(0x80);
  local_ba = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"command line",&local_b9);
  CommandLineStream::CommandLineStream
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,(char **)cin,psVar2);
  local_ba = 0;
  this_01 = (CommandLineParser *)&local_88;
  local_88 = cin;
  if (cin != (_Base_ptr)0x0) {
    (*(code *)((*(ParseStream **)cin)->
              super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).start)();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"\n\t\r ",&local_e1);
  this_00 = (ParseStream *)local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_109 + 1),"",(allocator *)this_00);
  ParseStream::ParseStream
            (this_00,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
             (bool)multiLine);
  if (psVar2 != (string *)0x0) {
    ppCVar1 = (CommandLineOption **)&local_80->_M_dataplus;
    local_80 = psVar2;
    (**(code **)&(*ppCVar1)->description)();
    psVar2 = local_80;
  }
  local_80 = psVar2;
  std::__cxx11::string::~string((string *)(local_109 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_109);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  if (local_88 != (_Base_ptr)0x0) {
    (*(code *)((*(ParseStream **)local_88)->
              super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).past)();
  }
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  psVar2 = local_80;
  if (local_80 != (string *)0x0) {
    (**(code **)(*(long *)local_80 + 0x10))();
  }
  embree::FileName::FileName((FileName *)0x17a257);
  parseCommandLine(this_01,(Ref<embree::ParseStream> *)cin,in_RDI);
  embree::FileName::~FileName((FileName *)0x17a282);
  if (psVar2 != (string *)0x0) {
    (**(code **)(*(long *)psVar2 + 0x18))();
  }
  if (local_80 != (string *)0x0) {
    (**(code **)(*(long *)local_80 + 0x18))();
  }
  return;
}

Assistant:

void CommandLineParser::parseCommandLine(int argc, char** argv)
  {
    /* create stream for parsing */
    Ref<ParseStream> stream = new ParseStream(new CommandLineStream(argc, argv));
    
    /* parse command line */  
    parseCommandLine(stream, FileName());
  }